

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool ClipperLib::FullRangeNeeded(Polygon *pts)

{
  pointer pIVar1;
  ulong uVar2;
  bool bVar3;
  undefined8 *puVar4;
  long64 *plVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  pIVar1 = (pts->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(pts->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pIVar1;
  if (lVar6 == 0) {
    bVar3 = false;
  }
  else {
    lVar6 = lVar6 >> 4;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    plVar5 = &pIVar1->Y;
    bVar3 = false;
    do {
      uVar2 = ((IntPoint *)(plVar5 + -1))->X;
      uVar7 = -uVar2;
      if (0 < (long)uVar2) {
        uVar7 = uVar2;
      }
      if (0x3fffffffffffffff < uVar7) {
LAB_0067a8e8:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "Coordinate exceeds range bounds.";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
      uVar2 = *plVar5;
      uVar8 = -uVar2;
      if (0 < (long)uVar2) {
        uVar8 = uVar2;
      }
      if (0x3fffffffffffffff < uVar8) goto LAB_0067a8e8;
      if (0x3fffffff < (uVar8 | uVar7)) {
        bVar3 = true;
      }
      plVar5 = plVar5 + 2;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return bVar3;
}

Assistant:

bool FullRangeNeeded(const Polygon &pts)
{
  bool result = false;
  for (Polygon::size_type i = 0; i <  pts.size(); ++i)
  {
    if (Abs(pts[i].X) > hiRange || Abs(pts[i].Y) > hiRange)
        throw "Coordinate exceeds range bounds.";
      else if (Abs(pts[i].X) > loRange || Abs(pts[i].Y) > loRange)
        result = true;
  }
  return result;
}